

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O0

void __thiscall
GmmLib::PageTable::AllocateDummyTables(PageTable *this,Table **L2Table,Table **L1Table)

{
  GMM_PAGETABLEPool *Elem;
  GmmPageTablePool *Pool;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  MidLevelTable *this_00;
  SyncInfo *pSVar3;
  uint32_t *puVar4;
  int *piVar5;
  undefined4 extraout_var_00;
  LastLevelTable *this_01;
  GMM_LIB_CONTEXT *pGVar6;
  WA_TABLE *pWVar7;
  bool bVar8;
  uint local_13c;
  uint local_138;
  LastLevelTable *local_108;
  MidLevelTable *local_d0;
  SyncInfoLin local_c0;
  uint local_b0;
  undefined1 local_a9;
  uint32_t PerTableNodes;
  undefined4 local_9c;
  GMM_PAGETABLEPool *pGStack_98;
  POOL_TYPE PoolType_1;
  GMM_PAGETABLEPool *PoolElem_1;
  undefined1 auStack_88 [4];
  uint32_t PoolNodeIdx_1;
  uint64_t local_80;
  HANDLE local_68;
  uint64_t uStack_60;
  undefined1 local_51;
  MidLevelTable *local_50;
  undefined4 local_44;
  GmmPageTablePool *pGStack_40;
  POOL_TYPE PoolType;
  GMM_PAGETABLEPool *PoolElem;
  undefined8 uStack_30;
  uint32_t PoolNodeIdx;
  LastLevelTable *pL1Tbl;
  GMM_GFX_ADDRESS L3TableAdr;
  Table **L1Table_local;
  Table **L2Table_local;
  PageTable *this_local;
  
  pL1Tbl = (LastLevelTable *)0xffffffffffffffff;
  uStack_30 = 0;
  if (this->pClientContext != (GmmClientContext *)0x0) {
    if ((this->TTL3).L3Handle != (HANDLE)0x0) {
      pL1Tbl = (LastLevelTable *)(this->TTL3).GfxAddress;
    }
    PoolElem._4_4_ = 0x200;
    pGStack_40 = (GmmPageTablePool *)0x0;
    local_44 = 3;
    L3TableAdr = (GMM_GFX_ADDRESS)L1Table;
    L1Table_local = L2Table;
    L2Table_local = (Table **)this;
    iVar1 = (*this->PageTableMgr->_vptr_GmmPageTableMgr[4])
                      (this->PageTableMgr,(long)&PoolElem + 4,3);
    pGStack_40 = (GmmPageTablePool *)CONCAT44(extraout_var,iVar1);
    if (pGStack_40 != (GmmPageTablePool *)0x0) {
      this_00 = (MidLevelTable *)operator_new(0x30);
      uVar2 = PoolElem._4_4_;
      Pool = pGStack_40;
      local_51 = 0;
      local_d0 = (MidLevelTable *)0x0;
      if (this_00 != (MidLevelTable *)0x0) {
        local_51 = 1;
        local_50 = this_00;
        pSVar3 = GmmPageTablePool::GetNodeBBInfoAtIndex(pGStack_40,PoolElem._4_4_);
        local_68 = pSVar3->BBQueueHandle;
        uStack_60 = pSVar3->BBFence;
        MidLevelTable::MidLevelTable(this_00,Pool,uVar2,*pSVar3);
        local_d0 = this_00;
      }
      *L1Table_local = &local_d0->super_Table;
      uVar2 = PoolElem._4_4_ / (uint)this->NodesPerTable;
      puVar4 = GmmPageTablePool::GetNodeUsageAtIndex
                         (pGStack_40,PoolElem._4_4_ / (uint)(this->NodesPerTable << 5));
      *puVar4 = *puVar4 | (uint)(1L << ((byte)uVar2 & 0x1f));
      SyncInfoLin::SyncInfoLin((SyncInfoLin *)auStack_88);
      pSVar3 = GmmPageTablePool::GetNodeBBInfoAtIndex(pGStack_40,PoolElem._4_4_);
      pSVar3->BBQueueHandle = _auStack_88;
      pSVar3->BBFence = local_80;
      iVar1 = this->NodesPerTable;
      piVar5 = GmmPageTablePool::GetNumFreeNode(pGStack_40);
      *piVar5 = *piVar5 - iVar1;
    }
    PoolElem_1._4_4_ = 0x200;
    pGStack_98 = (GMM_PAGETABLEPool *)0x0;
    local_9c = 2;
    iVar1 = (*this->PageTableMgr->_vptr_GmmPageTableMgr[4])
                      (this->PageTableMgr,(long)&PoolElem_1 + 4,2);
    pGStack_98 = (GMM_PAGETABLEPool *)CONCAT44(extraout_var_00,iVar1);
    if (pGStack_98 != (GMM_PAGETABLEPool *)0x0) {
      this_01 = (LastLevelTable *)operator_new(0x38);
      uVar2 = PoolElem_1._4_4_;
      Elem = pGStack_98;
      local_a9 = 0;
      local_108 = (LastLevelTable *)0x0;
      if (this_01 != (LastLevelTable *)0x0) {
        local_a9 = 1;
        _PerTableNodes = this_01;
        pGVar6 = GetGmmLibContext(this);
        pWVar7 = Context::GetWaTable(pGVar6);
        iVar1 = 8;
        if ((*(ulong *)&pWVar7->field_0x4 >> 0x2e & 1) != 0) {
          iVar1 = 0x20;
        }
        LastLevelTable::LastLevelTable(this_01,Elem,uVar2,iVar1,0);
        local_108 = this_01;
      }
      *(LastLevelTable **)L3TableAdr = local_108;
      if ((*(long *)L3TableAdr != 0) && (PoolElem_1._4_4_ != 0x200)) {
        if (this->TTType == AUXTT) {
          pGVar6 = GetGmmLibContext(this);
          if (pGVar6 == (GMM_LIB_CONTEXT *)0x0) {
            local_138 = 2;
          }
          else {
            pGVar6 = GetGmmLibContext(this);
            pWVar7 = Context::GetWaTable(pGVar6);
            bVar8 = true;
            if (((uint)((ulong)*(undefined8 *)&pWVar7->field_0x4 >> 0x2f) & 1) == 0) {
              pGVar6 = GetGmmLibContext(this);
              pWVar7 = Context::GetWaTable(pGVar6);
              bVar8 = (*(ulong *)&pWVar7->field_0x4 >> 0x2e & 1) != 0;
            }
            local_138 = 1;
            if (bVar8) {
              local_138 = 2;
            }
          }
          local_13c = local_138;
        }
        else {
          local_13c = 1;
        }
        local_b0 = local_13c;
        uVar2 = PoolElem_1._4_4_ / local_13c;
        puVar4 = GmmPageTablePool::GetNodeUsageAtIndex
                           (pGStack_98,PoolElem_1._4_4_ / (local_13c << 5));
        *puVar4 = *puVar4 | (uint)(1L << ((byte)uVar2 & 0x1f));
        SyncInfoLin::SyncInfoLin(&local_c0);
        pSVar3 = GmmPageTablePool::GetNodeBBInfoAtIndex(pGStack_98,PoolElem_1._4_4_);
        uVar2 = local_b0;
        pSVar3->BBQueueHandle = local_c0.BBQueueHandle;
        pSVar3->BBFence = local_c0.BBFence;
        piVar5 = GmmPageTablePool::GetNumFreeNode(pGStack_98);
        *piVar5 = *piVar5 - uVar2;
      }
    }
  }
  return;
}

Assistant:

void GmmLib::PageTable::AllocateDummyTables(GmmLib::Table **L2Table, GmmLib::Table **L1Table)
{
    GMM_GFX_ADDRESS         L3TableAdr = GMM_NO_TABLE;
    GmmLib::LastLevelTable *pL1Tbl     = NULL;

    __GMM_ASSERTPTR(pClientContext, VOIDRETURN);

    if(TTL3.L3Handle)
    {
        L3TableAdr = TTL3.GfxAddress;
    }
    else
    {
        //Should never hit -- L3Table is allocated during device creation
        __GMM_ASSERT(false);
    }

    //Allocate dummy L2Table
    {
        uint32_t                   PoolNodeIdx = PAGETABLE_POOL_MAX_NODES;
        GmmLib::GMM_PAGETABLEPool *PoolElem    = NULL;
        POOL_TYPE                  PoolType    = POOL_TYPE_AUXTTL2;
        PoolElem                               = PageTableMgr->__GetFreePoolNode(&PoolNodeIdx, PoolType);
        if(PoolElem)
        {
            *L2Table = new GmmLib::MidLevelTable(PoolElem, PoolNodeIdx, PoolElem->GetNodeBBInfoAtIndex(PoolNodeIdx));
            ASSIGN_POOLNODE(PoolElem, PoolNodeIdx, NodesPerTable)
        }
    }

    //Allocate dummy L1Table
    {
        uint32_t                   PoolNodeIdx = PAGETABLE_POOL_MAX_NODES;
        GmmLib::GMM_PAGETABLEPool *PoolElem    = NULL;
        POOL_TYPE                  PoolType    = POOL_TYPE_AUXTTL1;

        PoolElem = PageTableMgr->__GetFreePoolNode(&PoolNodeIdx, PoolType); //Recognize if Aux-L1 being allocated
        if(PoolElem)
        {
            *L1Table = new GmmLib::LastLevelTable(PoolElem, PoolNodeIdx, GMM_L1_SIZE_DWORD(TTType, GetGmmLibContext()), 0); // use TR vs Aux L1_Size_DWORD

            if(*L1Table)
            {
                if(PoolNodeIdx != PAGETABLE_POOL_MAX_NODES)
                {
                    uint32_t PerTableNodes = (TTType == AUXTT) ? AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetGmmLibContext()) : 1;
                    ASSIGN_POOLNODE(PoolElem, PoolNodeIdx, PerTableNodes)
                }
            }
        }
    }
}